

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O0

void __thiscall
antlr::NoViableAltException::NoViableAltException(NoViableAltException *this,RefAST *t)

{
  Token *in_RSI;
  string *in_RDI;
  string *s;
  RecognitionException *in_stack_ffffffffffffff90;
  string local_68 [8];
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  undefined1 local_31 [49];
  
  s = (string *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  RecognitionException::RecognitionException
            (in_stack_ffffffffffffff90,s,in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  *(undefined ***)in_RDI = &PTR__NoViableAltException_00521350;
  TokenRefCount<antlr::Token>::TokenRefCount((TokenRefCount<antlr::Token> *)in_RDI,in_RSI);
  ASTRefCount<antlr::AST>::ASTRefCount
            ((ASTRefCount<antlr::AST> *)in_RDI,(ASTRefCount<antlr::AST> *)in_RSI);
  return;
}

Assistant:

NoViableAltException::NoViableAltException(RefAST t)
  : RecognitionException("NoViableAlt","<AST>",-1,-1),
    token(0), node(t)
{
}